

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xml.cpp
# Opt level: O1

bool __thiscall Xml::Private::parse(Private *this,char *data,Element *element)

{
  usize *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  char *pcVar6;
  int iVar7;
  String local_60;
  Element *local_38;
  
  (this->pos).line = 1;
  (this->pos).lineStart = data;
  (this->pos).pos = data;
  local_38 = element;
  skipSpace(this);
  pcVar6 = (this->pos).pos;
  if (*pcVar6 == '<') {
    do {
      if (pcVar6[1] != '?') break;
      iVar2 = (this->pos).line;
      iVar3 = *(int *)&(this->pos).pos;
      (this->pos).pos = pcVar6 + 2;
      iVar4 = *(int *)&(this->pos).lineStart;
      do {
        pcVar6 = String::findOneOf((this->pos).pos,"\r\n?");
        if (pcVar6 == (char *)0x0) {
          local_60.data = &local_60._data;
          local_60._data.ref = 0;
          local_60._data.str = "Unexpected end of file";
          local_60._data.len = 0x16;
          this->errorLine = iVar2;
          this->errorColumn = (iVar3 - iVar4) + 1;
          String::operator=(&this->errorString,&local_60);
          if ((local_60.data)->ref != 0) {
            LOCK();
            puVar1 = &(local_60.data)->ref;
            *puVar1 = *puVar1 - 1;
            UNLOCK();
            if ((*puVar1 == 0) && (local_60.data != (Data *)0x0)) {
              operator_delete__(local_60.data);
            }
          }
          iVar7 = 1;
LAB_001083ce:
          bVar5 = false;
        }
        else {
          if ((*pcVar6 == '?') && (pcVar6[1] == '>')) {
            (this->pos).pos = pcVar6 + 2;
            iVar7 = 4;
            goto LAB_001083ce;
          }
          (this->pos).pos = pcVar6 + 1;
          skipSpace(this);
          iVar7 = 0;
          bVar5 = true;
        }
      } while (iVar7 == 0);
      if (iVar7 == 4) {
        skipSpace(this);
      }
      else if (!bVar5) {
        return false;
      }
      pcVar6 = (this->pos).pos;
    } while (*pcVar6 == '<');
  }
  bVar5 = readToken(this);
  if (bVar5) {
    if ((this->token).type == startTagBeginType) {
      bVar5 = parseElement(this,local_38);
      return bVar5;
    }
    local_60.data = &local_60._data;
    local_60._data.ref = 0;
    local_60._data.str = "Expected \'<\'";
    local_60._data.len = 0xc;
    iVar2 = *(int *)&(this->token).pos.pos;
    this->errorLine = (this->token).pos.line;
    this->errorColumn = (iVar2 - *(int *)&(this->token).pos.lineStart) + 1;
    String::operator=(&this->errorString,&local_60);
    if ((local_60.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_60.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_60.data != (Data *)0x0)) {
        operator_delete__(local_60.data);
      }
    }
  }
  return false;
}

Assistant:

bool Xml::Private::parse(const char* data, Element& element)
{
  pos.line = 1;
  pos.pos = pos.lineStart = data;

  skipSpace();
  while(*pos.pos == '<' && pos.pos[1] == '?')
  {
    Position startPos = pos;
    pos.pos += 2;
    for(;;)
    {
      const char* end = String::findOneOf(pos.pos, "\r\n?");
      if(!end)
        return this->syntaxError(startPos, "Unexpected end of file"), false;
      if(*end == '?' && end[1] == '>')
      {
        pos.pos = end + 2;
        break;
      }
      pos.pos = end + 1;
      skipSpace();
    }
    skipSpace();
  }
  if(!readToken())
    return false;
  if(token.type != Token::startTagBeginType)
    return syntaxError(token.pos, "Expected '<'"), false;
  return parseElement(element);
}